

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O2

bool test::SendPreconnectData(SDKConnection *connection)

{
  ostringstream *poVar1;
  OutputWorker *pOVar2;
  bool bVar3;
  SDKResult result;
  string local_760;
  string Hello;
  LogStringBuffer local_720;
  uint8_t hello [1401];
  
  memset(hello,0,0x579);
  hello[0] = '\x05';
  std::__cxx11::string::string((string *)&Hello,"Pre-connect message",(allocator *)&local_720);
  memcpy(hello + 1,Hello._M_dataplus._M_p,Hello._M_string_length + 1);
  FunctionTimer::BeginCall((FunctionTimer *)t_tonk_send);
  result = tonk::SDKConnection::Send(connection,hello,Hello._M_string_length + 2,0x32);
  FunctionTimer::EndCall((FunctionTimer *)t_tonk_send);
  if (result.Result == Tonk_Success) {
    FunctionTimer::BeginCall((FunctionTimer *)t_tonk_send);
    result = tonk::SDKConnection::Send(connection,&PreConnectData,10,0x37);
    FunctionTimer::EndCall((FunctionTimer *)t_tonk_send);
    if (result.Result == Tonk_Success) {
      if (DAT_0010f268 < 2) {
        poVar1 = &local_720.LogStream;
        local_720.ChannelName = Logger;
        local_720.LogLevel = Debug;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&DAT_0010f298);
        std::operator<<((ostream *)poVar1,"Sent preconnect data");
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,&local_720);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      FunctionTimer::BeginCall((FunctionTimer *)t_tonk_flush);
      tonk::SDKConnection::Flush(connection);
      bVar3 = true;
      FunctionTimer::EndCall((FunctionTimer *)t_tonk_flush);
      goto LAB_00106398;
    }
    tonk::SDKResult::ToString_abi_cxx11_(&local_760,&result);
    if (DAT_0010f268 < 5) {
      poVar1 = &local_720.LogStream;
      local_720.ChannelName = Logger;
      local_720.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&DAT_0010f298);
      std::operator<<((ostream *)poVar1,"tonk_send 2 failed: ");
      std::operator<<((ostream *)poVar1,(string *)&local_760);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,&local_720);
      goto LAB_00106384;
    }
  }
  else {
    tonk::SDKResult::ToString_abi_cxx11_(&local_760,&result);
    if (DAT_0010f268 < 5) {
      poVar1 = &local_720.LogStream;
      local_720.ChannelName = Logger;
      local_720.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&DAT_0010f298);
      std::operator<<((ostream *)poVar1,"tonk_send 1 failed: ");
      std::operator<<((ostream *)poVar1,(string *)&local_760);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,&local_720);
LAB_00106384:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_720.LogStream);
    }
  }
  std::__cxx11::string::~string((string *)&local_760);
  bVar3 = false;
LAB_00106398:
  std::__cxx11::string::~string((string *)&Hello);
  return bVar3;
}

Assistant:

bool SendPreconnectData(tonk::SDKConnection* connection)
{
    uint8_t hello[1 + 1400] = {};
    hello[0] = ID_ConnectionRebroadcast;
    std::string Hello = "Pre-connect message";
    memcpy(hello + 1, Hello.c_str(), Hello.length() + 1);

    t_tonk_send.BeginCall();
    tonk::SDKResult result = connection->Send(hello, 1 + Hello.length() + 1, TonkChannel_Reliable0);
    t_tonk_send.EndCall();

    if (!result)
    {
        Logger.Error("tonk_send 1 failed: ", result.ToString());
        return false;
    }

    t_tonk_send.BeginCall();
    result = connection->Send(PreConnectData, kPreConnectDataBytes, kPreConnectChannel);
    t_tonk_send.EndCall();

    if (!result)
    {
        Logger.Error("tonk_send 2 failed: ", result.ToString());
        return false;
    }

    Logger.Debug("Sent preconnect data");

    t_tonk_flush.BeginCall();
    connection->Flush();
    t_tonk_flush.EndCall();

    return true;
}